

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alldiff.cpp
# Opt level: O1

bool __thiscall AllDiffDomain<0>::tarjan(AllDiffDomain<0> *this,int node)

{
  Node *pNVar1;
  bool *pbVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  Node *pNVar6;
  IntVar *pIVar7;
  bool bVar8;
  Tchar *pTVar9;
  int iVar10;
  long lVar11;
  int iVar12;
  int iVar13;
  
  pNVar6 = this->var_nodes;
  pNVar6[node].mark = true;
  iVar12 = this->index;
  this->index = iVar12 + 1;
  pNVar6[node].index = iVar12;
  pNVar6[node].next = this->stack;
  this->stack = node;
  pNVar6[node].scc = -1;
  pNVar6[node].leak = false;
  if (node < this->sz) {
    pIVar7 = this->x[node].var;
    iVar12 = (pIVar7->min).v;
    while( true ) {
      iVar13 = -0x80000000;
      if (iVar12 != (pIVar7->max).v) {
        pTVar9 = pIVar7->vals + iVar12;
        iVar13 = iVar12;
        do {
          pTVar9 = pTVar9 + 1;
          iVar13 = iVar13 + 1;
        } while (pTVar9->v == '\0');
      }
      if ((this->val_nodes[iVar12].mark == false) &&
         (bVar8 = tarjan(this,this->sz + iVar12), !bVar8)) break;
      pNVar6 = this->val_nodes;
      if (pNVar6[iVar12].scc < 0) {
        iVar10 = this->var_nodes[node].index;
        if (pNVar6[iVar12].index < iVar10) {
          iVar10 = pNVar6[iVar12].index;
        }
        this->var_nodes[node].index = iVar10;
      }
      else if ((pNVar6[iVar12].leak == false) && (bVar8 = prune(this,node,iVar12), !bVar8)) break;
      pbVar2 = &this->var_nodes[node].leak;
      *pbVar2 = (bool)(*pbVar2 | this->val_nodes[iVar12].leak);
      iVar12 = iVar13;
    }
LAB_0015a466:
    bVar8 = false;
  }
  else {
    iVar13 = pNVar6[node].match.v;
    lVar11 = (long)iVar13;
    if (lVar11 < 0) {
      pNVar6[node].leak = true;
    }
    else {
      if ((pNVar6[lVar11].mark == false) && (bVar8 = tarjan(this,iVar13), !bVar8))
      goto LAB_0015a466;
      pNVar6 = this->var_nodes;
      if (pNVar6[lVar11].scc < 0) {
        iVar13 = pNVar6[node].index;
        if (pNVar6[lVar11].index < pNVar6[node].index) {
          iVar13 = pNVar6[lVar11].index;
        }
        pNVar6[node].index = iVar13;
      }
      pNVar6[node].leak = (bool)(pNVar6[node].leak | pNVar6[lVar11].leak);
    }
    pNVar6 = this->var_nodes;
    bVar8 = true;
    if (iVar12 <= pNVar6[node].index) {
      pNVar1 = pNVar6 + node;
      bVar3 = pNVar1->leak;
      uVar4 = this->stack;
      this->stack = pNVar1->next;
      pNVar1->next = -1;
      for (uVar5 = uVar4; -1 < (int)uVar5; uVar5 = pNVar6[uVar5].next) {
        pNVar6[uVar5].leak = bVar3;
        pNVar6[uVar5].scc = uVar4;
      }
    }
  }
  return bVar8;
}

Assistant:

bool tarjan(int node) {
		var_nodes[node].mark = true;

		const int index_save = index++;
		var_nodes[node].index = index_save;

		var_nodes[node].next = stack;
		stack = node;
		var_nodes[node].scc = -1;  // means stacked

		var_nodes[node].leak = false;
		if (node < sz) {
			// visiting var node
			for (typename IntView<U>::iterator i = x[node].begin(); i != x[node].end();) {
				const int val = *i++;
				if (!val_nodes[val].mark && !tarjan(sz + val)) {
					return false;
				}
				if (val_nodes[val].scc < 0) {
					var_nodes[node].index = std::min(var_nodes[node].index, val_nodes[val].index);
				} else if (!val_nodes[val].leak && !prune(node, val)) {
					return false;
				}
				var_nodes[node].leak |= val_nodes[val].leak;
			}
		} else {
			// visiting val node
			const int var = var_nodes[node].match;
			if (var < 0) {
				var_nodes[node].leak = true;  // unassigned value
			} else {
				if (!var_nodes[var].mark && !tarjan(var)) {
					return false;
				}
				if (var_nodes[var].scc < 0) {
					var_nodes[node].index = std::min(var_nodes[node].index, var_nodes[var].index);
				}
				var_nodes[node].leak |= var_nodes[var].leak;
			}
		}

		if (var_nodes[node].index >= index_save) {  // node is SCC-root
			const int leak = static_cast<int>(var_nodes[node].leak);
			const int scc = stack;
			stack = var_nodes[node].next;
			var_nodes[node].next = -1;

			// fprintf(stderr, "leak %d\n", leak);
			for (int i = scc; i >= 0; i = var_nodes[i].next) {
				assert(var_nodes[i].mark);
				var_nodes[i].leak = (leak != 0);  // propagate through SCC
				var_nodes[i].scc = scc;           // propagate through SCC
																					// if (i < sz)
																					//  fprintf(stderr, "  var %d\n", i);
																					// else
																					//  fprintf(stderr, "  val %d\n", i - sz);
			}
		}
		return true;
	}